

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_dither(rf_image *__return_storage_ptr__,rf_image image,int r_bpp,int g_bpp,int b_bpp,
               int a_bpp,rf_allocator allocator,rf_allocator temp_allocator)

{
  rf_color *prVar1;
  rf_color rVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  rf_source_location rVar7;
  rf_source_location source_location;
  rf_allocator_args rVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  rf_color *prVar20;
  undefined8 in_R9;
  long *in_FS_OFFSET;
  undefined4 uStack_b4;
  uint uStack_84;
  long local_68;
  rf_int x;
  rf_int y;
  unsigned_short a_pixel;
  unsigned_short b_pixel;
  unsigned_short g_pixel;
  unsigned_short r_pixel;
  int b_error;
  int g_error;
  int r_error;
  rf_color new_pixel;
  rf_color old_pixel;
  rf_color *pixels;
  int a_bpp_local;
  int b_bpp_local;
  int g_bpp_local;
  int r_bpp_local;
  
  memset(__return_storage_ptr__,0,0x18);
  if ((((undefined1  [24])image & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) &&
     (image.format == RF_UNCOMPRESSED_R8G8B8)) {
    if (r_bpp + g_bpp + b_bpp + a_bpp < 0x10) {
      prVar20 = rf_image_pixels_to_rgba32(image,temp_allocator);
      for (x = 0; x < image.height; x = x + 1) {
        for (local_68 = 0; local_68 < image.width; local_68 = local_68 + 1) {
          rVar2 = prVar20[x * image.width + local_68];
          uVar13 = (int)((uint)rVar2 & 0xff) >> (8U - (char)r_bpp & 0x1f);
          bVar9 = (byte)uVar13;
          r_error._1_1_ = rVar2.g;
          cVar4 = (char)g_bpp;
          uVar14 = (int)(uint)r_error._1_1_ >> (8U - cVar4 & 0x1f);
          bVar10 = (byte)uVar14;
          r_error._2_1_ = rVar2.b;
          cVar5 = (char)b_bpp;
          uVar15 = (int)(uint)r_error._2_1_ >> (8U - cVar5 & 0x1f);
          bVar11 = (byte)uVar15;
          bVar6 = (byte)a_bpp;
          bVar12 = (byte)((int)((uint)rVar2 >> 0x18) >> (8 - bVar6 & 0x1f));
          iVar16 = ((uint)rVar2 & 0xff) - ((uVar13 & 0xff) << (8U - (char)r_bpp & 0x1f));
          iVar17 = (uint)r_error._1_1_ - ((uVar14 & 0xff) << (8U - cVar4 & 0x1f));
          iVar18 = (uint)r_error._2_1_ - ((uVar15 & 0xff) << (8U - cVar5 & 0x1f));
          prVar1 = prVar20 + x * image.width + local_68;
          prVar1->r = bVar9;
          prVar1->g = bVar10;
          prVar1->b = bVar11;
          prVar1->a = bVar12;
          if (local_68 < image.width + -1) {
            iVar19 = rf_min_i((uint)prVar20[x * image.width + local_68 + 1].r +
                              (int)(((float)iVar16 * 7.0) / 16.0),0xff);
            prVar20[x * image.width + local_68 + 1].r = (uchar)iVar19;
            iVar19 = rf_min_i((uint)prVar20[x * image.width + local_68 + 1].g +
                              (int)(((float)iVar17 * 7.0) / 16.0),0xff);
            prVar20[x * image.width + local_68 + 1].g = (uchar)iVar19;
            iVar19 = rf_min_i((uint)prVar20[x * image.width + local_68 + 1].b +
                              (int)(((float)iVar18 * 7.0) / 16.0),0xff);
            prVar20[x * image.width + local_68 + 1].b = (uchar)iVar19;
          }
          if ((0 < local_68) && (x < image.height + -1)) {
            iVar19 = rf_min_i((uint)prVar20[(x + 1) * (long)image.width + local_68 + -1].r +
                              (int)(((float)iVar16 * 3.0) / 16.0),0xff);
            prVar20[(x + 1) * (long)image.width + local_68 + -1].r = (uchar)iVar19;
            iVar19 = rf_min_i((uint)prVar20[(x + 1) * (long)image.width + local_68 + -1].g +
                              (int)(((float)iVar17 * 3.0) / 16.0),0xff);
            prVar20[(x + 1) * (long)image.width + local_68 + -1].g = (uchar)iVar19;
            iVar19 = rf_min_i((uint)prVar20[(x + 1) * (long)image.width + local_68 + -1].b +
                              (int)(((float)iVar18 * 3.0) / 16.0),0xff);
            prVar20[(x + 1) * (long)image.width + local_68 + -1].b = (uchar)iVar19;
          }
          if (x < image.height + -1) {
            iVar19 = rf_min_i((uint)prVar20[(x + 1) * (long)image.width + local_68].r +
                              (int)(((float)iVar16 * 5.0) / 16.0),0xff);
            prVar20[(x + 1) * (long)image.width + local_68].r = (uchar)iVar19;
            iVar19 = rf_min_i((uint)prVar20[(x + 1) * (long)image.width + local_68].g +
                              (int)(((float)iVar17 * 5.0) / 16.0),0xff);
            prVar20[(x + 1) * (long)image.width + local_68].g = (uchar)iVar19;
            iVar19 = rf_min_i((uint)prVar20[(x + 1) * (long)image.width + local_68].b +
                              (int)(((float)iVar18 * 5.0) / 16.0),0xff);
            prVar20[(x + 1) * (long)image.width + local_68].b = (uchar)iVar19;
          }
          if ((local_68 < image.width + -1) && (x < image.height + -1)) {
            iVar16 = rf_min_i((uint)prVar20[(x + 1) * (long)image.width + local_68 + 1].r +
                              (int)(((float)iVar16 * 1.0) / 16.0),0xff);
            prVar20[(x + 1) * (long)image.width + local_68 + 1].r = (uchar)iVar16;
            iVar16 = rf_min_i((uint)prVar20[(x + 1) * (long)image.width + local_68 + 1].g +
                              (int)(((float)iVar17 * 1.0) / 16.0),0xff);
            prVar20[(x + 1) * (long)image.width + local_68 + 1].g = (uchar)iVar16;
            iVar16 = rf_min_i((uint)prVar20[(x + 1) * (long)image.width + local_68 + 1].b +
                              (int)(((float)iVar18 * 1.0) / 16.0),0xff);
            prVar20[(x + 1) * (long)image.width + local_68 + 1].b = (uchar)iVar16;
          }
          *(ushort *)((long)image.data + (x * image.width + local_68) * 2) =
               (ushort)bVar9 << (cVar4 + cVar5 + bVar6 & 0x1f) |
               (ushort)bVar10 << (cVar5 + bVar6 & 0x1f) | (ushort)bVar11 << (bVar6 & 0x1f) |
               (ushort)bVar12;
        }
      }
      rVar7.proc_name = "rf_image_dither";
      rVar7.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      rVar7.line_in_file = 0x3fb3;
      rVar8.size_to_allocate_or_reallocate = 0;
      rVar8.pointer_to_free_or_realloc = prVar20;
      rVar8._16_8_ = (ulong)uStack_84 << 0x20;
      (*temp_allocator.allocator_proc)(&temp_allocator,rVar7,RF_AM_FREE,rVar8);
    }
    else {
      source_location.proc_name = "rf_image_dither";
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.line_in_file = 0x3fb5;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported",1,
                  (ulong)(uint)(r_bpp + g_bpp + b_bpp + a_bpp),"rf_image_dither",in_R9);
      lVar3 = *in_FS_OFFSET;
      *(char **)(lVar3 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar3 + -0x458) = "rf_image_dither";
      *(undefined8 *)(lVar3 + -0x450) = 0x3fb5;
      *(ulong *)(lVar3 + -0x448) = CONCAT44(uStack_b4,1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_dither(const rf_image image, int r_bpp, int g_bpp, int b_bpp, int a_bpp, rf_allocator allocator, rf_allocator temp_allocator)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (image.format == RF_UNCOMPRESSED_R8G8B8)
        {
            if (image.format == RF_UNCOMPRESSED_R8G8B8 && (r_bpp + g_bpp + b_bpp + a_bpp) < 16)
            {
                rf_color* pixels = rf_image_pixels_to_rgba32(image, temp_allocator);

                if ((image.format != RF_UNCOMPRESSED_R8G8B8) && (image.format != RF_UNCOMPRESSED_R8G8B8A8))
                {
                    RF_LOG(RF_LOG_TYPE_WARNING, "rf_image format is already 16bpp or lower, dithering could have no effect");
                }

                // Todo: Finish implementing this function
//                // Define new image format, check if desired bpp match internal known format
//                if ((r_bpp == 5) && (g_bpp == 6) && (b_bpp == 5) && (a_bpp == 0)) image.format = RF_UNCOMPRESSED_R5G6B5;
//                else if ((r_bpp == 5) && (g_bpp == 5) && (b_bpp == 5) && (a_bpp == 1)) image.format = RF_UNCOMPRESSED_R5G5B5A1;
//                else if ((r_bpp == 4) && (g_bpp == 4) && (b_bpp == 4) && (a_bpp == 4)) image.format = RF_UNCOMPRESSED_R4G4B4A4;
//                else
//                {
//                    image.format = 0;
//                    RF_LOG(RF_LOG_TYPE_WARNING, "Unsupported dithered OpenGL internal format: %ibpp (R%i_g%i_b%i_a%i)", (r_bpp + g_bpp + b_bpp + a_bpp), r_bpp, g_bpp, b_bpp, a_bpp);
//                }
//
//                // NOTE: We will store the dithered data as unsigned short (16bpp)
//                image.data = (unsigned short*) RF_ALLOC(image.allocator, image.width * image.height * sizeof(unsigned short));

                rf_color old_pixel = RF_WHITE;
                rf_color new_pixel  = RF_WHITE;

                int r_error, g_error, b_error;
                unsigned short r_pixel, g_pixel, b_pixel, a_pixel; // Used for 16bit pixel composition

                for (rf_int y = 0; y < image.height; y++)
                {
                    for (rf_int x = 0; x < image.width; x++)
                    {
                        old_pixel = pixels[y * image.width + x];

                        // NOTE: New pixel obtained by bits truncate, it would be better to round values (check rf_image_format())
                        new_pixel.r = old_pixel.r >> (8 - r_bpp); // R bits
                        new_pixel.g = old_pixel.g >> (8 - g_bpp); // G bits
                        new_pixel.b = old_pixel.b >> (8 - b_bpp); // B bits
                        new_pixel.a = old_pixel.a >> (8 - a_bpp); // A bits (not used on dithering)

                        // NOTE: Error must be computed between new and old pixel but using same number of bits!
                        // We want to know how much color precision we have lost...
                        r_error = (int)old_pixel.r - (int)(new_pixel.r << (8 - r_bpp));
                        g_error = (int)old_pixel.g - (int)(new_pixel.g << (8 - g_bpp));
                        b_error = (int)old_pixel.b - (int)(new_pixel.b << (8 - b_bpp));

                        pixels[y*image.width + x] = new_pixel;

                        // NOTE: Some cases are out of the array and should be ignored
                        if (x < (image.width - 1))
                        {
                            pixels[y*image.width + x+1].r = rf_min_i((int)pixels[y * image.width + x + 1].r + (int)((float)r_error * 7.0f / 16), 0xff);
                            pixels[y*image.width + x+1].g = rf_min_i((int)pixels[y * image.width + x + 1].g + (int)((float)g_error * 7.0f / 16), 0xff);
                            pixels[y*image.width + x+1].b = rf_min_i((int)pixels[y * image.width + x + 1].b + (int)((float)b_error * 7.0f / 16), 0xff);
                        }

                        if ((x > 0) && (y < (image.height - 1)))
                        {
                            pixels[(y+1)*image.width + x-1].r = rf_min_i((int)pixels[(y + 1) * image.width + x - 1].r + (int)((float)r_error * 3.0f / 16), 0xff);
                            pixels[(y+1)*image.width + x-1].g = rf_min_i((int)pixels[(y + 1) * image.width + x - 1].g + (int)((float)g_error * 3.0f / 16), 0xff);
                            pixels[(y+1)*image.width + x-1].b = rf_min_i((int)pixels[(y + 1) * image.width + x - 1].b + (int)((float)b_error * 3.0f / 16), 0xff);
                        }

                        if (y < (image.height - 1))
                        {
                            pixels[(y+1)*image.width + x].r = rf_min_i((int)pixels[(y+1)*image.width + x].r + (int)((float)r_error*5.0f/16), 0xff);
                            pixels[(y+1)*image.width + x].g = rf_min_i((int)pixels[(y+1)*image.width + x].g + (int)((float)g_error*5.0f/16), 0xff);
                            pixels[(y+1)*image.width + x].b = rf_min_i((int)pixels[(y+1)*image.width + x].b + (int)((float)b_error*5.0f/16), 0xff);
                        }

                        if ((x < (image.width - 1)) && (y < (image.height - 1)))
                        {
                            pixels[(y+1)*image.width + x+1].r = rf_min_i((int)pixels[(y+1)*image.width + x+1].r + (int)((float)r_error*1.0f/16), 0xff);
                            pixels[(y+1)*image.width + x+1].g = rf_min_i((int)pixels[(y+1)*image.width + x+1].g + (int)((float)g_error*1.0f/16), 0xff);
                            pixels[(y+1)*image.width + x+1].b = rf_min_i((int)pixels[(y+1)*image.width + x+1].b + (int)((float)b_error*1.0f/16), 0xff);
                        }

                        r_pixel = (unsigned short)new_pixel.r;
                        g_pixel = (unsigned short)new_pixel.g;
                        b_pixel = (unsigned short)new_pixel.b;
                        a_pixel = (unsigned short)new_pixel.a;

                        ((unsigned short *)image.data)[y*image.width + x] = (r_pixel << (g_bpp + b_bpp + a_bpp)) | (g_pixel << (b_bpp + a_bpp)) | (b_pixel << a_bpp) | a_pixel;
                    }
                }

                RF_FREE(temp_allocator, pixels);
            }
            else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Unsupported dithering bpps (%ibpp), only 16bpp or lower modes supported", (r_bpp + g_bpp + b_bpp + a_bpp));
        }
    }

    return result;
}